

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O0

Plane * anon_unknown.dwarf_20aaf::parsePlane(Plane *__return_storage_ptr__,ifstream *file)

{
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  char *pcVar4;
  void *pvVar5;
  invalid_argument *piVar6;
  Plane *plane;
  char local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [48];
  string local_30 [8];
  string token;
  ifstream *file_local;
  
  memset(__return_storage_ptr__,0,0x24);
  __return_storage_ptr__->d = 0.0;
  __return_storage_ptr__->reflectionCoefficient = 0.0;
  std::__cxx11::string::string(local_30);
  while( true ) {
    piVar3 = std::operator>>((istream *)file,local_30);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    if (*pcVar4 == '#') {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)file,local_30);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"endPlane");
      if (bVar1) break;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"point");
      if (bVar1) {
        pvVar5 = (void *)std::istream::operator>>(file,(float *)__return_storage_ptr__);
        pvVar5 = (void *)std::istream::operator>>(pvVar5,&(__return_storage_ptr__->P).y);
        std::istream::operator>>(pvVar5,&(__return_storage_ptr__->P).z);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"normalVector");
        if (bVar1) {
          pvVar5 = (void *)std::istream::operator>>(file,&(__return_storage_ptr__->normal).x);
          pvVar5 = (void *)std::istream::operator>>(pvVar5,&(__return_storage_ptr__->normal).y);
          std::istream::operator>>(pvVar5,&(__return_storage_ptr__->normal).z);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"coef");
          if (bVar1) {
            std::istream::operator>>(file,&__return_storage_ptr__->d);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,"color");
            if (bVar1) {
              operator>>((istream *)file,&__return_storage_ptr__->color);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_30,"reflection");
              if (!bVar1) {
                piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::operator+(local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)"Unknown token \'");
                std::operator+(local_60,local_80);
                std::invalid_argument::invalid_argument(piVar6,(string *)local_60);
                __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
              std::istream::operator>>(file,&__return_storage_ptr__->reflectionCoefficient);
            }
          }
        }
      }
    }
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Invalid config file format.");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

Plane parsePlane(std::ifstream& file)
{
  Plane plane{};
  std::string token;
  while (file >> token)
  {
    if (token[0] == '#') // comment, skip entire line
      std::getline(file, token);
    else if (token == "endPlane")
      break;
    else if (token == "point")
      file >> plane.P.x >> plane.P.y >> plane.P.z;
    else if (token == "normalVector")
      file >> plane.normal.x >> plane.normal.y >> plane.normal.z;
    else if (token == "coef")
      file >> plane.d;
    else if (token == "color")
      file >> plane.color;
    else if (token == "reflection")
      file >> plane.reflectionCoefficient;
    else
      throw std::invalid_argument("Unknown token '" + token + "'");
    if (!file.good())
      throw std::invalid_argument("Invalid config file format.");
  }
  return plane;
}